

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall GdlGlyphIntersectionClassDefn::ComputeMembers(GdlGlyphIntersectionClassDefn *this)

{
  long lVar1;
  pointer ppGVar2;
  GdlGlyphClassMember *pGVar3;
  pointer puVar4;
  GdlGlyphDefn *this_00;
  size_t igid2;
  long lVar5;
  size_t igid1;
  ulong uVar6;
  ulong uVar7;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vgidResult;
  GrpLineAndFile lnf;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vgid1;
  
  vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vgid1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vgid1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vgid1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*((*(this->m_vpglfdSets).
       super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>._M_impl.
       super__Vector_impl_data._M_start)->super_GdlDefn)._vptr_GdlDefn[0x12])();
  uVar7 = 1;
  do {
    ppGVar2 = (this->m_vpglfdSets).
              super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpglfdSets).
                      super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3) <= uVar7) {
      GrpLineAndFile::GrpLineAndFile
                (&lnf,&(this->super_GdlGlyphClassDefn).super_GdlGlyphClassMember.super_GdlDefn.
                       super_GdlObject.m_lnf);
      for (uVar7 = 0;
          puVar4 = vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)vgidResult.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)vgidResult.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 1); uVar7 = uVar7 + 1) {
        this_00 = (GdlGlyphDefn *)operator_new(0xb0);
        GdlGlyphDefn::GdlGlyphDefn(this_00,kglftGlyphID,(uint)puVar4[uVar7]);
        GdlGlyphDefn::AddGlyphID
                  (this_00,vgidResult.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar7]);
        GdlGlyphClassDefn::AddMember
                  (&this->super_GdlGlyphClassDefn,(GdlGlyphClassMember *)this_00,&lnf);
      }
      std::__cxx11::string::~string((string *)&lnf.m_staFile);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&vgid1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      return;
    }
    if (vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start) {
      vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    lnf.m_staFile._M_string_length = 0;
    lnf.m_nLinePre = 0;
    lnf.m_nLineOrig = 0;
    lnf.m_staFile._M_dataplus._M_p = (pointer)0x0;
    pGVar3 = ppGVar2[uVar7];
    (*(pGVar3->super_GdlDefn)._vptr_GdlDefn[0x12])(pGVar3,&lnf);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)vgid1.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)vgid1.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 1); uVar6 = uVar6 + 1) {
      lVar5 = 0;
      do {
        if ((long)lnf.m_staFile._M_dataplus._M_p - lnf._0_8_ >> 1 == lVar5) goto LAB_0011e1f3;
        lVar1 = lVar5 * 2;
        lVar5 = lVar5 + 1;
      } while (*(value_type_conflict3 *)(lnf._0_8_ + lVar1) !=
               vgid1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6]);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&vgidResult,
                 vgid1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar6);
LAB_0011e1f3:
    }
    std::vector<unsigned_short,std::allocator<unsigned_short>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)&vgid1,
               vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start,
               vgidResult.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&lnf);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void GdlGlyphIntersectionClassDefn::ComputeMembers()
{
	std::vector<utf16> vgidResult;

	std::vector<utf16> vgid1;
	m_vpglfdSets[0]->FlattenGlyphList(vgid1);

	for (size_t iglfc = 1; iglfc < this->m_vpglfdSets.size(); iglfc++)
	{
		vgidResult.clear();
		std::vector<utf16> vgid2;
		m_vpglfdSets[iglfc]->FlattenGlyphList(vgid2);
		for (size_t igid1 = 0; igid1 < vgid1.size(); igid1++)
		{
			bool fFound = false;
			for (size_t igid2 = 0; igid2 < vgid2.size(); igid2++)
			{
				if (vgid2[igid2] == vgid1[igid1])
				{
					fFound = true;
					break;
				}
			}
			if (fFound)
				vgidResult.push_back(vgid1[igid1]);

		}
		vgid1.assign(vgidResult.begin(), vgidResult.end());
	}

	// Fake a simple class definition that contains these glyphs.
	GrpLineAndFile lnf = this->LineAndFile();
	for (size_t igid = 0; igid < vgidResult.size(); igid++)
	{
		GdlGlyphDefn * pglfd = new GdlGlyphDefn(kglftGlyphID, vgidResult[igid]);
		pglfd->AddGlyphID(vgidResult[igid]);
		this->AddMember(pglfd, lnf);
	}
}